

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O3

bool mahjong::is_waiting(hand_tiles_t *hand_tiles,useful_table_t *useful_table)

{
  tile_t *standing_tiles;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  intptr_t standing_cnt;
  bool *pbVar5;
  bool *pbVar6;
  byte bVar7;
  useful_table_t table_basic;
  useful_table_t table_special;
  bool local_b8 [80];
  bool local_68 [72];
  
  bVar7 = 0;
  if (hand_tiles->tile_count == 10) {
    standing_cnt = 10;
  }
  else {
    if (hand_tiles->tile_count != 0xd) {
      bVar1 = false;
      goto LAB_001079c4;
    }
    standing_tiles = hand_tiles->standing_tiles;
    iVar3 = thirteen_orphans_shanten(standing_tiles,0xd,(useful_table_t *)local_b8);
    if (((iVar3 == 0) ||
        (iVar3 = honors_and_knitted_tiles_shanten(standing_tiles,0xd,(useful_table_t *)local_b8),
        iVar3 == 0)) ||
       (iVar3 = seven_pairs_shanten(standing_tiles,0xd,(useful_table_t *)local_b8), iVar3 == 0)) {
      pbVar5 = local_b8;
      pbVar6 = local_68;
      for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)pbVar6 = *(undefined8 *)pbVar5;
        pbVar5 = (bool *)((long)pbVar5 + ((ulong)bVar7 * -2 + 1) * 8);
        pbVar6 = pbVar6 + ((ulong)bVar7 * -2 + 1) * 8;
      }
      bVar1 = true;
      goto LAB_001079c4;
    }
    standing_cnt = 0xd;
  }
  bVar1 = is_knitted_straight_wait(hand_tiles->standing_tiles,standing_cnt,&local_68);
LAB_001079c4:
  bVar2 = is_basic_form_wait(hand_tiles->standing_tiles,hand_tiles->tile_count,
                             (useful_table_t *)local_b8);
  if (useful_table != (useful_table_t *)0x0) {
    if ((bVar1 & bVar2) == 1) {
      lVar4 = 0;
      do {
        (*useful_table)[lVar4] = (bool)(local_b8[lVar4] | local_68[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x48);
    }
    else if ((bVar2 | bVar1) == 1) {
      pbVar5 = local_68;
      if (bVar2) {
        pbVar5 = local_b8;
      }
      memcpy(useful_table,pbVar5,0x48);
    }
  }
  return (bool)(bVar1 | bVar2);
}

Assistant:

bool is_waiting(const hand_tiles_t &hand_tiles, useful_table_t *useful_table) {
    bool spcial_waiting = false, basic_waiting = false;
    useful_table_t table_special, table_basic;

    if (hand_tiles.tile_count == 13) {
        if (is_thirteen_orphans_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_honors_and_knitted_tiles_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_seven_pairs_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_knitted_straight_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
    }
    else if (hand_tiles.tile_count == 10) {
        if (is_knitted_straight_wait(hand_tiles.standing_tiles, 10, &table_special)) {
            spcial_waiting = true;
        }
    }

    if (is_basic_form_wait(hand_tiles.standing_tiles, hand_tiles.tile_count, &table_basic)) {
        basic_waiting = true;
    }

    if (useful_table != nullptr) {
        if (spcial_waiting && basic_waiting) {
            std::transform(std::begin(table_special), std::end(table_special), std::begin(table_basic), std::begin(*useful_table),
                [](bool a, bool b) { return a || b; });
        }
        else if (basic_waiting) {
            memcpy(*useful_table, table_basic, sizeof(table_basic));
        }
        else if (spcial_waiting) {
            memcpy(*useful_table, table_special, sizeof(table_special));
        }
    }

    return (spcial_waiting || basic_waiting);
}